

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
pbrt::SplitStringsFromWhitespace_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,pbrt *this,string_view str)

{
  int iVar1;
  pbrt *ppVar2;
  pbrt *ppVar3;
  pbrt *ppVar4;
  pbrt *ppVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppVar2 = (pbrt *)str._M_len;
  ppVar3 = this + (long)ppVar2;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar5 = ppVar2;
  do {
    while ((ppVar4 = ppVar2, ppVar5 != ppVar3 &&
           (iVar1 = isspace((int)(char)*ppVar5), ppVar4 = ppVar5, iVar1 != 0))) {
      ppVar2 = ppVar3;
      ppVar5 = ppVar5 + 1;
    }
    ppVar5 = ppVar4;
    if (ppVar4 == ppVar3) {
      bVar6 = true;
      ppVar2 = ppVar4;
    }
    else {
      do {
        iVar1 = isspace((int)(char)*ppVar5);
        bVar6 = iVar1 == 0;
        ppVar2 = ppVar5;
        if (!bVar6) break;
        ppVar5 = ppVar5 + 1;
        ppVar2 = ppVar3;
      } while (ppVar5 != ppVar3);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,ppVar4,ppVar2);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    ppVar5 = ppVar2;
    if (bVar6) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::vector<std::string> SplitStringsFromWhitespace(std::string_view str) {
    std::vector<std::string> ret;

    std::string_view::iterator start = str.begin();
    do {
        // skip leading ws
        while (start != str.end() && isspace(*start))
            ++start;

        // |start| is at the start of the current word
        auto end = start;
        while (end != str.end() && !isspace(*end))
            ++end;

        ret.push_back(std::string(start, end));
        start = end;
    } while (start != str.end());

    return ret;
}